

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_rescursive_signal.cpp
# Opt level: O2

int main(void)

{
  slot_type *s_00;
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int in_ESI;
  int *args;
  int local_94;
  connection c;
  signal<void_(int)> s;
  
  obs::signal<void_(int)>::signal(&s,in_ESI,in_RDX);
  s_00 = (slot_type *)operator_new(0x28);
  (s_00->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00104d80;
  *(signal<void_(int)> **)&(s_00->f).super__Function_base._M_functor = &s;
  *(connection **)((long)&(s_00->f).super__Function_base._M_functor + 8) = &c;
  (s_00->f)._M_invoker =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_rescursive_signal.cpp:12:5)>
       ::_M_invoke;
  (s_00->f).super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_rescursive_signal.cpp:12:5)>
       ::_M_manager;
  c = obs::signal<void_(int)>::add_slot(&s,s_00);
  args = &local_94;
  local_94 = 5;
  obs::signal<void(int)>::operator()((signal<void(int)> *)&s,args);
  obs::signal<void_(int)>::~signal(&s,(int)args,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void(int)> s;     // We have to use "obs::" because ambiguous name from sys/signal.h on macOS?
  obs::connection c = s.connect(
    [&](int i){
      if (i > 0)
        s(i-1);
      else
        c.disconnect();
    });
  s(5);
}